

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O0

void __thiscall VMFrameStack::~VMFrameStack(VMFrameStack *this)

{
  BlockHeader *pBVar1;
  VMFrame *pVVar2;
  BlockHeader *next_1;
  BlockHeader *block_1;
  BlockHeader *next;
  BlockHeader *block;
  VMFrameStack *this_local;
  
  do {
    pVVar2 = PopFrame(this);
  } while (pVVar2 != (VMFrame *)0x0);
  if (this->Blocks != (BlockHeader *)0x0) {
    pBVar1 = this->Blocks;
    while (next = pBVar1, next != (BlockHeader *)0x0) {
      pBVar1 = next->NextBlock;
      if (next != (BlockHeader *)0x0) {
        operator_delete__(next);
      }
    }
  }
  if (this->UnusedBlocks != (BlockHeader *)0x0) {
    pBVar1 = this->UnusedBlocks;
    while (next_1 = pBVar1, next_1 != (BlockHeader *)0x0) {
      pBVar1 = next_1->NextBlock;
      if (next_1 != (BlockHeader *)0x0) {
        operator_delete__(next_1);
      }
    }
  }
  this->Blocks = (BlockHeader *)0x0;
  this->UnusedBlocks = (BlockHeader *)0x0;
  return;
}

Assistant:

VMFrameStack::~VMFrameStack()
{
	while (PopFrame() != NULL)
	{ }
	if (Blocks != NULL)
	{
		BlockHeader *block, *next;
		for (block = Blocks; block != NULL; block = next)
		{
			next = block->NextBlock;
			delete[] (VM_UBYTE *)block;
		}
	}
	if (UnusedBlocks != NULL)
	{
		BlockHeader *block, *next;
		for (block = UnusedBlocks; block != NULL; block = next)
		{
			next = block->NextBlock;
			delete[] (VM_UBYTE *)block;
		}
	}
	Blocks = NULL;
	UnusedBlocks = NULL;
}